

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# play.c
# Opt level: O2

float xm_next_of_sample(xm_channel_context_t *ch)

{
  float fVar1;
  uint uVar2;
  xm_loop_type_t xVar3;
  uint uVar4;
  xm_sample_t *sample;
  uint32_t uVar5;
  int iVar6;
  ulong uVar7;
  size_t sVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  if (((ch->instrument == (xm_instrument_t *)0x0) ||
      (sample = ch->sample, sample == (xm_sample_t *)0x0)) ||
     (fVar1 = ch->sample_position, fVar1 < 0.0)) {
    uVar7 = ch->frame_count;
    fVar13 = 0.0;
    goto joined_r0x00104e76;
  }
  uVar2 = sample->length;
  if (uVar2 == 0) {
    return 0.0;
  }
  uVar7 = (ulong)fVar1;
  iVar6 = (int)uVar7;
  uVar5 = iVar6 + 1;
  fVar9 = xm_sample_at(sample,uVar7 & 0xffffffff);
  xVar3 = sample->loop_type;
  fVar13 = fVar9;
  if (xVar3 == XM_PING_PONG_LOOP) {
    if (ch->ping == true) {
      fVar12 = fVar1 + ch->step;
      ch->sample_position = fVar12;
      uVar4 = sample->loop_end;
      sVar8 = uVar7 & 0xffffffff;
      if (uVar5 < uVar4) {
        sVar8 = (size_t)uVar5;
      }
      fVar10 = xm_sample_at(sample,sVar8);
      if ((float)uVar4 <= fVar12) {
        ch->ping = false;
        fVar12 = (float)(uVar4 * 2) - fVar12;
        ch->sample_position = fVar12;
      }
      if ((float)uVar2 <= fVar12) {
        ch->ping = false;
        fVar12 = fVar12 - (float)(uVar2 - 1);
        goto LAB_00104f9c;
      }
    }
    else {
      fVar11 = fVar1 - ch->step;
      ch->sample_position = fVar11;
      if (iVar6 == 0) {
        uVar5 = sample->loop_start;
        sVar8 = 0;
      }
      else {
        uVar5 = sample->loop_start;
        sVar8 = uVar7 & 0xffffffff;
        if (uVar5 < iVar6 - 1U) {
          sVar8 = (size_t)(iVar6 - 1U);
        }
      }
      fVar13 = xm_sample_at(sample,sVar8);
      if (fVar11 <= (float)uVar5) {
        ch->ping = true;
        fVar11 = (float)(uVar5 * 2) - fVar11;
        ch->sample_position = fVar11;
      }
      fVar12 = 0.0;
      fVar10 = fVar9;
      if (fVar11 <= 0.0) {
        ch->ping = true;
        fVar9 = fVar13;
LAB_00104f9c:
        ch->sample_position = fVar12;
        fVar13 = fVar9;
      }
    }
  }
  else {
    if (xVar3 == XM_FORWARD_LOOP) {
      uVar2 = sample->loop_end;
      if (uVar5 == uVar2) {
        uVar5 = sample->loop_start;
      }
      fVar10 = xm_sample_at(sample,(ulong)uVar5);
      for (fVar12 = fVar1 + ch->step; (float)uVar2 <= fVar12;
          fVar12 = fVar12 - (float)sample->loop_length) {
      }
      goto LAB_00104f9c;
    }
    fVar10 = 0.0;
    if (xVar3 == XM_NO_LOOP) {
      if (uVar5 < uVar2) {
        fVar10 = xm_sample_at(sample,(ulong)uVar5);
      }
      fVar12 = fVar1 + ch->step;
      ch->sample_position = fVar12;
      if ((float)uVar2 <= fVar12) {
        fVar12 = -1.0;
        goto LAB_00104f9c;
      }
    }
  }
  fVar13 = (fVar1 - (float)(uVar7 & 0xffffffff)) * (fVar10 - fVar13) + fVar13;
  uVar7 = ch->frame_count;
joined_r0x00104e76:
  if (uVar7 < 0x20) {
    fVar13 = (fVar13 - ch->end_of_previous_sample[uVar7]) * (float)(long)uVar7 * 0.03125 +
             ch->end_of_previous_sample[uVar7];
  }
  return fVar13;
}

Assistant:

static float xm_next_of_sample(xm_channel_context_t* ch) {
	if(ch->instrument == NULL || ch->sample == NULL || ch->sample_position < 0) {
#if XM_RAMPING
		if(ch->frame_count < XM_SAMPLE_RAMPING_POINTS) {
			return XM_LERP(ch->end_of_previous_sample[ch->frame_count], .0f,
			               (float)ch->frame_count / (float)XM_SAMPLE_RAMPING_POINTS);
		}
#endif
		return .0f;
	}
	if(ch->sample->length == 0) {
		return .0f;
	}

	float u, v, t;
	uint32_t a, b;
	a = (uint32_t)ch->sample_position; /* This cast is fine,
										* sample_position will not
										* go above integer
										* ranges */
	if(XM_LINEAR_INTERPOLATION) {
		b = a + 1;
		t = ch->sample_position - a; /* Cheaper than fmodf(., 1.f) */
	}
	u = xm_sample_at(ch->sample, a);

	switch(ch->sample->loop_type) {

	case XM_NO_LOOP:
		if(XM_LINEAR_INTERPOLATION) {
			v = (b < ch->sample->length) ? xm_sample_at(ch->sample, b) : .0f;
		}
		ch->sample_position += ch->step;
		if(ch->sample_position >= ch->sample->length) {
			ch->sample_position = -1;
		}
		break;

	case XM_FORWARD_LOOP:
		if(XM_LINEAR_INTERPOLATION) {
			v = xm_sample_at(
				ch->sample,
				(b == ch->sample->loop_end) ? ch->sample->loop_start : b
				);
		}
		ch->sample_position += ch->step;
		while(ch->sample_position >= ch->sample->loop_end) {
			ch->sample_position -= ch->sample->loop_length;
		}
		break;

	case XM_PING_PONG_LOOP:
		if(ch->ping) {
			ch->sample_position += ch->step;
		} else {
			ch->sample_position -= ch->step;
		}
		/* XXX: this may not work for very tight ping-pong loops
		 * (ie switches direction more than once per sample */
		if(ch->ping) {
			if(XM_LINEAR_INTERPOLATION) {
				v = xm_sample_at(ch->sample, (b >= ch->sample->loop_end) ? a : b);
			}
			if(ch->sample_position >= ch->sample->loop_end) {
				ch->ping = false;
				ch->sample_position = (ch->sample->loop_end << 1) - ch->sample_position;
			}
			/* sanity checking */
			if(ch->sample_position >= ch->sample->length) {
				ch->ping = false;
				ch->sample_position -= ch->sample->length - 1;
			}
		} else {
			if(XM_LINEAR_INTERPOLATION) {
				v = u;
				u = xm_sample_at(
					ch->sample,
					(b == 1 || b - 2 <= ch->sample->loop_start) ? a : (b - 2)
					);
			}
			if(ch->sample_position <= ch->sample->loop_start) {
				ch->ping = true;
				ch->sample_position = (ch->sample->loop_start << 1) - ch->sample_position;
			}
			/* sanity checking */
			if(ch->sample_position <= .0f) {
				ch->ping = true;
				ch->sample_position = .0f;
			}
		}
		break;

	default:
		v = .0f;
		break;
	}

	float endval = (XM_LINEAR_INTERPOLATION ? XM_LERP(u, v, t) : u);

#if XM_RAMPING
	if(ch->frame_count < XM_SAMPLE_RAMPING_POINTS) {
		/* Smoothly transition between old and new sample. */
		return XM_LERP(ch->end_of_previous_sample[ch->frame_count], endval,
		               (float)ch->frame_count / (float)XM_SAMPLE_RAMPING_POINTS);
	}
#endif

	return endval;
}